

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
* __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::
emplace<std::__cxx11::string_const&,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>>
          (pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
           *__return_storage_ptr__,
          Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_> *args_1)

{
  pointer pcVar1;
  Node n;
  long *local_50 [2];
  long local_40 [2];
  _Head_base<0UL,_Rml::DataModel_*,_false> local_30;
  
  pcVar1 = (args->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + args->_M_string_length);
  local_30._M_head_impl =
       (args_1->_M_t).super___uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_>.
       _M_t.super__Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>.
       super__Head_base<0UL,_Rml::DataModel_*,_false>._M_head_impl;
  (args_1->_M_t).super___uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_>._M_t.
  super__Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>.
  super__Head_base<0UL,_Rml::DataModel_*,_false>._M_head_impl = (DataModel *)0x0;
  doInsert<robin_hood::detail::Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>::DataNode<robin_hood::detail::Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,true>>
            (__return_storage_ptr__,this,
             (DataNode<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
              *)local_50);
  std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>::~unique_ptr
            ((unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_> *)&local_30);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace(Args&&... args) {
        ROBIN_HOOD_TRACE(this)
        Node n{*this, std::forward<Args>(args)...};
        auto r = doInsert(std::move(n));
        if (!r.second) {
            // insertion not possible: destroy node
            // NOLINTNEXTLINE(bugprone-use-after-move)
            n.destroy(*this);
        }
        return r;
    }